

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O0

void pageant_passphrase_request_refused(PageantClientDialogId *dlgid)

{
  PageantKey *pk;
  PageantClientDialogId *dlgid_local;
  
  if (gui_request_in_progress) {
    gui_request_in_progress = false;
    *(undefined1 *)&dlgid[-6].dummy = 0;
    fail_requests_for_key((PageantKey *)(dlgid + -0x14),"user refused to supply passphrase");
    unblock_pending_gui_requests();
    return;
  }
  __assert_fail("gui_request_in_progress",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/pageant.c",0x251,
                "void pageant_passphrase_request_refused(PageantClientDialogId *)");
}

Assistant:

void pageant_passphrase_request_refused(PageantClientDialogId *dlgid)
{
    PageantKey *pk = container_of(dlgid, PageantKey, dlgid);

    assert(gui_request_in_progress);
    gui_request_in_progress = false;
    pk->decryption_prompt_active = false;

    fail_requests_for_key(pk, "user refused to supply passphrase");

    unblock_pending_gui_requests();
}